

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTAudioEngine_Release(FACTAudioEngine *pEngine)

{
  uint32_t *in_RDI;
  FACTAudioEngine *in_stack_00000010;
  uint32_t local_4;
  
  FAudio_PlatformLockMutex((FAudioMutex)0x11018a);
  *in_RDI = *in_RDI - 1;
  if (*in_RDI == 0) {
    FACTAudioEngine_ShutDown(in_stack_00000010);
    FAudio_PlatformDestroyMutex((FAudioMutex)0x1101dc);
    FAudio_PlatformDestroyMutex((FAudioMutex)0x1101ed);
    FAudio_PlatformUnlockMutex((FAudioMutex)0x1101fe);
    FAudio_PlatformDestroyMutex((FAudioMutex)0x11020f);
    if (*(long *)(in_RDI + 0x42) != 0) {
      (**(code **)(in_RDI + 0x34))(*(undefined8 *)(in_RDI + 0x42));
    }
    (**(code **)(in_RDI + 0x34))(in_RDI);
    FAudio_PlatformRelease();
    local_4 = 0;
  }
  else {
    FAudio_PlatformUnlockMutex((FAudioMutex)0x1101b1);
    local_4 = *in_RDI;
  }
  return local_4;
}

Assistant:

uint32_t FACTAudioEngine_Release(FACTAudioEngine *pEngine)
{
	FAudio_PlatformLockMutex(pEngine->apiLock);
	pEngine->refcount -= 1;
	if (pEngine->refcount > 0)
	{
		FAudio_PlatformUnlockMutex(pEngine->apiLock);
		return pEngine->refcount;
	}
	FACTAudioEngine_ShutDown(pEngine);
	FAudio_PlatformDestroyMutex(pEngine->sbLock);
	FAudio_PlatformDestroyMutex(pEngine->wbLock);
	FAudio_PlatformUnlockMutex(pEngine->apiLock);
	FAudio_PlatformDestroyMutex(pEngine->apiLock);
	if (pEngine->settings != NULL)
	{
		pEngine->pFree(pEngine->settings);
	}
	pEngine->pFree(pEngine);
	FAudio_PlatformRelease();
	return 0;
}